

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

void __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>::rehash
          (HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks> *this,size_t targetSize)

{
  HashBucket *pHVar1;
  size_t sVar2;
  ArrayDisposer *pAVar3;
  size_t in_R8;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  Array<kj::_::HashBucket> local_20;
  
  oldBuckets.size_ = targetSize;
  oldBuckets.ptr = (HashBucket *)(this->buckets).size_;
  kj::_::rehash(&local_20,(_ *)(this->buckets).ptr,oldBuckets,in_R8);
  pHVar1 = (this->buckets).ptr;
  if (pHVar1 != (HashBucket *)0x0) {
    sVar2 = (this->buckets).size_;
    (this->buckets).ptr = (HashBucket *)0x0;
    (this->buckets).size_ = 0;
    pAVar3 = (this->buckets).disposer;
    (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pHVar1,8,sVar2,sVar2,0);
  }
  (this->buckets).ptr = local_20.ptr;
  (this->buckets).size_ = local_20.size_;
  (this->buckets).disposer = local_20.disposer;
  this->erasedCount = 0;
  return;
}

Assistant:

void rehash(size_t targetSize) {
    buckets = _::rehash(buckets, targetSize);
    erasedCount = 0;
  }